

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6cb367::TplModelTest_ComputeMVDifferenceTest_Test::TestBody
          (TplModelTest_ComputeMVDifferenceTest_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int_mv result_mv;
  int_mv mv;
  TplDepStats tpl_stats;
  int col;
  int row;
  TplDepStats stats_buf_small [4];
  int index;
  int mv_vals_small [4];
  int step_small;
  uint8_t right_shift_small;
  TplDepFrame tpl_frame_small;
  AssertHelper *in_stack_fffffffffffffb00;
  short *in_stack_fffffffffffffb08;
  char *in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  undefined4 uVar3;
  Type in_stack_fffffffffffffb2c;
  undefined4 in_stack_fffffffffffffb30;
  int in_stack_fffffffffffffb34;
  int in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  int in_stack_fffffffffffffb40;
  int in_stack_fffffffffffffb44;
  TplDepFrame *in_stack_fffffffffffffb48;
  AssertionResult local_4a0;
  int_mv local_490;
  undefined4 local_48c;
  Message *in_stack_fffffffffffffb78;
  AssertHelper *in_stack_fffffffffffffb80;
  int local_3c0;
  int local_3bc;
  short local_3b8 [406];
  int local_8c;
  undefined8 local_88;
  undefined8 local_80;
  int local_70;
  uint8_t local_69;
  undefined1 local_68;
  short *local_60;
  int local_28;
  int local_1c;
  int local_18;
  
  local_68 = 1;
  local_1c = 4;
  local_18 = 4;
  local_28 = 1;
  local_69 = '\x01';
  local_70 = 2;
  local_88 = 0x200000001;
  local_80 = 0x400000003;
  local_8c = 0;
  local_60 = local_3b8;
  for (local_3bc = 0; local_3bc < local_1c; local_3bc = local_70 + local_3bc) {
    for (local_3c0 = 0; local_3c0 < local_18; local_3c0 = local_70 + local_3c0) {
      local_48c = CONCAT22((short)*(undefined4 *)((long)&local_88 + (long)local_8c * 4),
                           (short)*(undefined4 *)((long)&local_88 + (long)local_8c * 4));
      local_8c = local_8c + 1;
      in_stack_fffffffffffffb08 = local_60;
      iVar2 = av1_tpl_ptr_pos(local_3bc,local_3c0,local_28,local_69);
      memcpy(in_stack_fffffffffffffb08 + (long)iVar2 * 100,&stack0xfffffffffffffb78,200);
    }
  }
  local_490 = av1_compute_mv_difference
                        (in_stack_fffffffffffffb48,in_stack_fffffffffffffb44,
                         in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                         in_stack_fffffffffffffb38,in_stack_fffffffffffffb34);
  testing::internal::EqHelper::Compare<short,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,(int *)in_stack_fffffffffffffb00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    in_stack_fffffffffffffb00 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x68f966);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,
               (char *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb1c,in_stack_fffffffffffffb10);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb00);
    testing::Message::~Message((Message *)0x68f9b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x68fa07);
  uVar3 = 1;
  testing::internal::EqHelper::Compare<short,_int,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
             in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,(int *)in_stack_fffffffffffffb00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffb28);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
    testing::AssertionResult::failure_message((AssertionResult *)0x68fa6f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),
               in_stack_fffffffffffffb2c,(char *)CONCAT44(uVar3,in_stack_fffffffffffffb20),
               in_stack_fffffffffffffb1c,in_stack_fffffffffffffb10);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb00);
    testing::Message::~Message((Message *)0x68fabb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x68fb0b);
  return;
}

Assistant:

TEST(TplModelTest, ComputeMVDifferenceTest) {
  TplDepFrame tpl_frame_small;
  tpl_frame_small.is_valid = true;
  tpl_frame_small.mi_rows = 4;
  tpl_frame_small.mi_cols = 4;
  tpl_frame_small.stride = 1;
  uint8_t right_shift_small = 1;
  int step_small = 1 << right_shift_small;

  // Test values for motion vectors.
  int mv_vals_small[4] = { 1, 2, 3, 4 };
  int index = 0;

  // 4x4 blocks means we need to allocate a 4 size array.
  // According to av1_tpl_ptr_pos:
  // (row >> right_shift) * stride + (col >> right_shift)
  // (4 >> 1) * 1 + (4 >> 1) = 4
  TplDepStats stats_buf_small[4];
  tpl_frame_small.tpl_stats_ptr = stats_buf_small;

  for (int row = 0; row < tpl_frame_small.mi_rows; row += step_small) {
    for (int col = 0; col < tpl_frame_small.mi_cols; col += step_small) {
      TplDepStats tpl_stats;
      tpl_stats.ref_frame_index[0] = 0;
      int_mv mv;
      mv.as_mv.row = mv_vals_small[index];
      mv.as_mv.col = mv_vals_small[index];
      index++;
      tpl_stats.mv[0] = mv;
      tpl_frame_small.tpl_stats_ptr[av1_tpl_ptr_pos(
          row, col, tpl_frame_small.stride, right_shift_small)] = tpl_stats;
    }
  }

  int_mv result_mv =
      av1_compute_mv_difference(&tpl_frame_small, 1, 1, step_small,
                                tpl_frame_small.stride, right_shift_small);

  // Expect the result to be exactly equal to 1 because this is the difference
  // between neighboring motion vectors in this instance.
  EXPECT_EQ(result_mv.as_mv.row, 1);
  EXPECT_EQ(result_mv.as_mv.col, 1);
}